

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_time.c
# Opt level: O0

int evutil_date_rfc1123(char *date,size_t datelen,tm *tm)

{
  int iVar1;
  undefined1 local_68 [8];
  tm sys;
  time_t t;
  tm *tm_local;
  size_t datelen_local;
  char *date_local;
  
  sys.tm_zone = (char *)time((time_t *)0x0);
  t = (time_t)tm;
  if (tm == (tm *)0x0) {
    gmtime_r((time_t *)&sys.tm_zone,(tm *)local_68);
    t = (time_t)local_68;
  }
  iVar1 = evutil_snprintf(date,datelen,"%s, %02d %s %4d %02d:%02d:%02d GMT",
                          evutil_date_rfc1123::DAYS[*(int *)(t + 0x18)],(ulong)*(uint *)(t + 0xc),
                          evutil_date_rfc1123::MONTHS[*(int *)(t + 0x10)],*(int *)(t + 0x14) + 0x76c
                          ,*(undefined4 *)(t + 8),*(undefined4 *)(t + 4),*(undefined4 *)t);
  return iVar1;
}

Assistant:

int
evutil_date_rfc1123(char *date, const size_t datelen, const struct tm *tm)
{
	static const char *DAYS[] =
		{ "Sun", "Mon", "Tue", "Wed", "Thu", "Fri", "Sat" };
	static const char *MONTHS[] =
		{ "Jan", "Feb", "Mar", "Apr", "May", "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec" };

	time_t t = time(NULL);

#ifndef _WIN32
	struct tm sys;
#endif

	/* If `tm` is null, set system's current time. */
	if (tm == NULL) {
#ifdef _WIN32
		/** TODO: detect _gmtime64()/_gmtime64_s() */
		tm = gmtime(&t);
#else
		gmtime_r(&t, &sys);
		tm = &sys;
#endif
	}

	return evutil_snprintf(
		date, datelen, "%s, %02d %s %4d %02d:%02d:%02d GMT",
		DAYS[tm->tm_wday], tm->tm_mday, MONTHS[tm->tm_mon],
		1900 + tm->tm_year, tm->tm_hour, tm->tm_min, tm->tm_sec);
}